

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

void mp_rshd(mp_int *a,int b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  mp_digit *pmVar4;
  int iVar5;
  long lVar6;
  
  if (0 < b) {
    iVar1 = a->used;
    iVar3 = iVar1 - b;
    if (iVar3 == 0 || iVar1 < b) {
      a->sign = 0;
      a->used = 0;
      pmVar4 = a->dp;
      iVar1 = a->alloc;
      for (lVar6 = 0; (int)lVar6 < iVar1; lVar6 = lVar6 + 1) {
        pmVar4[lVar6] = 0;
      }
      return;
    }
    pmVar4 = a->dp;
    iVar2 = 0;
    iVar5 = 0;
    if (0 < iVar3) {
      iVar2 = iVar3;
      iVar5 = iVar3;
    }
    while (iVar2 != 0) {
      *pmVar4 = pmVar4[(uint)b];
      pmVar4 = pmVar4 + 1;
      iVar2 = iVar2 + -1;
    }
    for (lVar6 = 0; iVar5 + (int)lVar6 < iVar1; lVar6 = lVar6 + 1) {
      pmVar4[lVar6] = 0;
    }
    a->used = iVar3;
  }
  return;
}

Assistant:

void mp_rshd (mp_int * a, int b)
{
  int     x;

  /* if b <= 0 then ignore it */
  if (b <= 0) {
    return;
  }

  /* if b > used then simply zero it and return */
  if (a->used <= b) {
    mp_zero (a);
    return;
  }

  {
    register mp_digit *bottom, *top;

    /* shift the digits down */

    /* bottom */
    bottom = a->dp;

    /* top [offset into digits] */
    top = a->dp + b;

    /* this is implemented as a sliding window where 
     * the window is b-digits long and digits from 
     * the top of the window are copied to the bottom
     *
     * e.g.

     b-2 | b-1 | b0 | b1 | b2 | ... | bb |   ---->
                 /\                   |      ---->
                  \-------------------/      ---->
     */
    for (x = 0; x < (a->used - b); x++) {
      *bottom++ = *top++;
    }

    /* zero the top digits */
    for (; x < a->used; x++) {
      *bottom++ = 0;
    }
  }
  
  /* remove excess digits */
  a->used -= b;
}